

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void biffread(bifcxdef *ctx,int argc)

{
  uchar **ppuVar1;
  byte bVar2;
  runcxdef *prVar3;
  bool bVar4;
  FILE *__stream;
  size_t sVar5;
  char *pcVar6;
  uint *puVar7;
  uint16_t tmp;
  uint siz;
  uchar *puVar8;
  anon_union_8_4_1dda36f5_for_runsv aVar9;
  byte *pbVar10;
  uint16_t tmp_1;
  ulong uVar11;
  char typ;
  runsdef val;
  int bin_mode;
  char buf [32];
  char local_151;
  runsdef local_150;
  int local_13c;
  uint local_138 [64];
  undefined1 local_38;
  
  __stream = (FILE *)bif_get_file(ctx,(int *)0x0,&local_13c);
  if (local_13c == 0) {
    prVar3 = ctx->bifcxrun;
    aVar9 = (anon_union_8_4_1dda36f5_for_runsv)prVar3->runcxhp;
    if ((uint)(*(int *)&prVar3->runcxhtop - (int)aVar9.runsvnum) < 0x203) {
      runhcmp(prVar3,0x202,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
      aVar9 = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
    }
    local_150.runstyp = '\x03';
    local_150.runsv = aVar9;
    pcVar6 = fgets((char *)local_138,0x100,__stream);
    if (pcVar6 != (char *)0x0) {
      pbVar10 = (byte *)(aVar9.runsvnum + 2);
      siz = 0x202;
      do {
        local_38 = 0;
        bVar4 = false;
        puVar7 = local_138;
LAB_00126980:
        bVar2 = (byte)*puVar7;
        if (0xc < bVar2) {
          if (bVar2 == 0x5c) {
            pbVar10[0] = 0x5c;
            pbVar10[1] = 0x5c;
            goto LAB_001269c5;
          }
          if (bVar2 == 0xd) goto LAB_001269a4;
LAB_001269ca:
          *pbVar10 = bVar2;
LAB_001269ce:
          puVar7 = (uint *)((long)puVar7 + 1);
          pbVar10 = pbVar10 + 1;
          goto LAB_00126980;
        }
        if (bVar2 == 9) {
          pbVar10[0] = 0x5c;
          pbVar10[1] = 0x74;
LAB_001269c5:
          pbVar10 = pbVar10 + 1;
          goto LAB_001269ce;
        }
        if (bVar2 == 10) {
LAB_001269a4:
          pbVar10[0] = 0x5c;
          pbVar10[1] = 0x6e;
          pbVar10 = pbVar10 + 1;
          bVar4 = true;
          goto LAB_001269ce;
        }
        if (bVar2 != 0) goto LAB_001269ca;
        if (bVar4) {
          *(short *)local_150.runsv.runsvstr = (short)((long)pbVar10 - (long)local_150.runsv);
          ppuVar1 = &ctx->bifcxrun->runcxhp;
          *ppuVar1 = *ppuVar1 + ((long)pbVar10 - (long)local_150.runsv & 0xffffffff);
          goto LAB_00126a7e;
        }
        siz = siz + 0x202;
        uVar11 = (long)pbVar10 - (long)local_150.runsv;
        *(short *)local_150.runsv.runsvstr = (short)uVar11;
        prVar3 = ctx->bifcxrun;
        puVar8 = prVar3->runcxhp;
        if ((uint)(*(int *)&prVar3->runcxhtop - (int)puVar8) <= siz) {
          runhcmp(prVar3,siz,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
          puVar8 = ctx->bifcxrun->runcxhp;
        }
        uVar11 = uVar11 & 0xffffffff;
        if ((uchar *)local_150.runsv.runsvnum != puVar8) {
          memmove(puVar8,local_150.runsv.runsvstr,uVar11);
          local_150.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
        }
        pbVar10 = local_150.runsv.runsvstr + uVar11;
        pcVar6 = fgets((char *)local_138,0x100,__stream);
      } while (pcVar6 != (char *)0x0);
    }
  }
  else {
    sVar5 = fread(&local_151,1,1,__stream);
    if (sVar5 == 1) {
      if (local_151 == '\b') {
        local_150.runstyp = '\b';
        runpush(ctx->bifcxrun,8,&local_150);
        return;
      }
      if (local_151 == '\x03') {
        sVar5 = fread(local_138,2,1,__stream);
        if (sVar5 == 1) {
          prVar3 = ctx->bifcxrun;
          puVar8 = prVar3->runcxhp;
          if ((uint)(*(int *)&prVar3->runcxhtop - (int)puVar8) <= (local_138[0] & 0xffff)) {
            runhcmp(prVar3,local_138[0] & 0xffff,0,(runsdef *)0x0,(runsdef *)0x0,(runsdef *)0x0);
            puVar8 = ctx->bifcxrun->runcxhp;
          }
          sVar5 = fread(puVar8 + 2,(ulong)(ushort)local_138[0] - 2,1,__stream);
          if (sVar5 == 1) {
            *(ushort *)ctx->bifcxrun->runcxhp = (ushort)local_138[0];
            local_150.runstyp = '\x03';
            local_150.runsv = (anon_union_8_4_1dda36f5_for_runsv)ctx->bifcxrun->runcxhp;
            ctx->bifcxrun->runcxhp = local_150.runsv.runsvstr + (ushort)local_138[0];
LAB_00126a7e:
            runrepush(ctx->bifcxrun,&local_150);
            return;
          }
        }
      }
      else if ((local_151 == '\x01') && (sVar5 = fread(local_138,4,1,__stream), sVar5 == 1)) {
        runpnum(ctx->bifcxrun,(long)(int)local_138[0]);
        return;
      }
    }
  }
  runpnil(ctx->bifcxrun);
  return;
}

Assistant:

void biffread(bifcxdef *ctx, int argc)
{
    osfildef *fp;
    char      typ;
    char      buf[32];
    runsdef   val;
    ushort    len;
    int       bin_mode;

    /* get the file pointer */
    bifcntargs(ctx, 1, argc);
    fp = bif_get_file(ctx, (int *)0, &bin_mode);

    if (bin_mode)
    {
        /* binary file - read the type byte */
        if (osfrb(fp, &typ, 1))
            goto ret_error;
        
        /* read the data according to the type */
        switch(typ)
        {
        case DAT_NUMBER:
            if (osfrb(fp, buf, 4))
                goto ret_error;
            runpnum(ctx->bifcxrun, osrp4s(buf));
            break;
            
        case DAT_SSTRING:
            /* get the size */
            if (osfrb(fp, buf, 2))
                goto ret_error;
            len = osrp2(buf);
            
            /* reserve space */
            runhres(ctx->bifcxrun, len, 0);
            
            /* read the string into the reserved space */
            if (osfrb(fp, ctx->bifcxrun->runcxhp + 2, len - 2))
                goto ret_error;
            
            /* set up the string */
            oswp2(ctx->bifcxrun->runcxhp, len);
            val.runstyp = DAT_SSTRING;
            val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
            
            /* consume the space */
            ctx->bifcxrun->runcxhp += len;
            
            /* push the value */
            runrepush(ctx->bifcxrun, &val);
            break;
            
        case DAT_TRUE:
            val.runstyp = DAT_TRUE;
            runpush(ctx->bifcxrun, DAT_TRUE, &val);
            break;
            
        default:
            goto ret_error;
        }
    }
    else
    {
        uchar  buf[257];
        uchar *dst;
        uchar *src;
        uint   len;
        uint   res_total;
        int    found_nl;

        /* 
         *   reserve some space in the heap - we'll initially reserve
         *   space for twice our buffer, in case every single character
         *   needs to be expanded into an escape sequence
         */
        res_total = sizeof(buf) * 2;
        runhres(ctx->bifcxrun, res_total, 0);

        /* set up our output value */
        val.runstyp = DAT_SSTRING;
        val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
        dst = ctx->bifcxrun->runcxhp + 2;

        /* keep going until we find a newline or run out of data */
        for (found_nl = FALSE ; !found_nl ; )
        {
            /* text-mode - read the result into our buffer */
            if (!osfgets((char *)buf, sizeof(buf) - 1, fp))
            {
                /* 
                 *   if we found a newline, return what we have;
                 *   otherwise, return an error 
                 */
                if (found_nl)
                    break;
                else
                    goto ret_error;
            }
            
            /* 
             *   make sure it's null-terminated, in case the buffer was
             *   full 
             */
            buf[256] = '\0';
            
            /* translate into the heap area we've reserved */
            for (src = buf ; *src != '\0' ; ++src, ++dst)
            {
                /* determine if we need translations */
                switch(*src)
                {
                case '\n':
                case '\r':
                    /* translate to a newline sequence */
                    *dst++ = '\\';
                    *dst = 'n';
                    
                    /* note that we've found our newline */
                    found_nl = TRUE;
                    break;
                    
                case '\t':
                    /* translate to a tab sequence */
                    *dst++ = '\\';
                    *dst = 't';
                    break;
                    
                case '\\':
                    /* expand to a double-backslash sequence */
                    *dst++ = '\\';
                    *dst = '\\';
                    break;

                default:
                    /* leave other characters intact */
                    *dst = *src;
                    break;
                }
            }

            /*
             *   If we didn't find the newline, we'll need more space.
             *   This is a bit tricky, because the space we've already set
             *   up may move if we compact the heap while asking for more
             *   space.  So, remember our current length, reserve another
             *   buffer-full of space, and set everything up at the new
             *   output location if necessary.  
             */
            if (!found_nl)
            {
                /* reserve another buffer-full (double for expansion) */
                res_total += sizeof(buf) * 2;

                /* note our current offset */
                len = dst - val.runsv.runsvstr;
                oswp2(val.runsv.runsvstr, len);

                /* ask for the space */
                runhres(ctx->bifcxrun, res_total, 0);

                /* 
                 *   Since we were at the top of the heap before, we
                 *   should still be at the top of the heap.  If not,
                 *   we'll have to copy from our old location to the new
                 *   top of the heap.  
                 */
                if (val.runsv.runsvstr != ctx->bifcxrun->runcxhp)
                {
                    /* copy our existing text to our new location */
                    memmove(ctx->bifcxrun->runcxhp, val.runsv.runsvstr, len);

                    /* fix up our pointer */
                    val.runsv.runsvstr = ctx->bifcxrun->runcxhp;
                }

                /* re-establish our output pointer at our new location */
                dst = val.runsv.runsvstr + len;
            }
        }

        /* finish setting up the string */
        len = dst - val.runsv.runsvstr;
        oswp2(val.runsv.runsvstr, len);

        /* consume the space */
        ctx->bifcxrun->runcxhp += len;

        /* push the value */
        runrepush(ctx->bifcxrun, &val);
    }

    /* success - we've already pushed the return value */
    return;

ret_error:
    runpnil(ctx->bifcxrun);
}